

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O0

int __thiscall RealDiskInterface::RemoveFile(RealDiskInterface *this,string *path)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  undefined8 uVar4;
  string *path_local;
  RealDiskInterface *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = remove(pcVar2);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 == 2) {
      this_local._4_4_ = 1;
    }
    else {
      uVar4 = std::__cxx11::string::c_str();
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      Error("remove(%s): %s",uVar4,pcVar2);
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RealDiskInterface::RemoveFile(const string& path) {
  if (remove(path.c_str()) < 0) {
    switch (errno) {
      case ENOENT:
        return 1;
      default:
        Error("remove(%s): %s", path.c_str(), strerror(errno));
        return -1;
    }
  } else {
    return 0;
  }
}